

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O3

void __thiscall kratos::InitValueVisitor::~InitValueVisitor(InitValueVisitor *this)

{
  _Manager_type p_Var1;
  
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002cf428;
  p_Var1 = (this->fn_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->fn_,(_Any_data *)&this->fn_,__destroy_functor);
  }
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002cc528;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->super_IRVisitor).visited_._M_h);
  operator_delete(this,0x68);
  return;
}

Assistant:

[[maybe_unused]] explicit InitValueVisitor(std::function<void(AssignStmt *)> fn)
        : fn_(std::move(fn)) {}